

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# y4minput.c
# Opt level: O0

void y4m_convert_42xpaldv_42xjpeg(y4m_input *_y4m,uchar *_dst,uchar *_aux)

{
  int iVar1;
  int iVar2;
  long in_RDX;
  long in_RSI;
  int *in_RDI;
  int x;
  int y;
  int pli;
  int c_sz;
  int c_h;
  int c_w;
  uchar *tmp;
  undefined1 local_37c;
  int local_378;
  int local_368;
  undefined1 local_354;
  int local_350;
  int local_340;
  int local_330;
  int local_320;
  int local_30c;
  int local_308;
  int local_2f8;
  undefined1 local_2e8;
  undefined1 local_2e4;
  int local_2e0;
  undefined1 local_2dc;
  int local_2d8;
  int local_2c8;
  int local_2b8;
  int local_2a8;
  undefined1 local_294;
  int local_290;
  int local_280;
  int local_270;
  int local_260;
  int local_250;
  byte *in_stack_fffffffffffffdb8;
  int in_stack_fffffffffffffdc0;
  int in_stack_fffffffffffffdc4;
  byte *in_stack_fffffffffffffdc8;
  int local_230;
  int local_220;
  int local_20c;
  int local_208;
  int local_1f8;
  int local_1e8;
  int local_1d8;
  int local_1c4;
  undefined1 local_1bc;
  int local_1b8;
  undefined1 local_1a4;
  int local_1a0;
  int local_190;
  int local_17c;
  int local_178;
  undefined1 local_168;
  undefined1 local_164;
  int local_160;
  undefined1 local_15c;
  int local_158;
  int local_148;
  int local_138;
  int local_128;
  undefined1 local_114;
  int local_110;
  int local_100;
  int local_f0;
  int local_e0;
  int local_d0;
  int local_c0;
  int local_b0;
  int local_a0;
  int local_8c;
  int local_88;
  int local_78;
  int local_68;
  int local_58;
  int local_44;
  int local_38;
  int local_34;
  int local_30;
  byte *local_20;
  long local_10;
  
  local_10 = in_RSI + *in_RDI * in_RDI[1];
  iVar1 = (*in_RDI + 1) / 2;
  iVar2 = (in_RDI[1] + in_RDI[9] + -1) / in_RDI[9];
  local_20 = (byte *)(in_RDX + iVar1 * iVar2 * 2);
  for (local_30 = 1; local_30 < 3; local_30 = local_30 + 1) {
    y4m_42xmpeg2_42xjpeg_helper
              (in_stack_fffffffffffffdc8,
               (uchar *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
               (int)((ulong)in_stack_fffffffffffffdb8 >> 0x20),(int)in_stack_fffffffffffffdb8);
    if (local_30 == 1) {
      for (local_38 = 0; local_38 < iVar1; local_38 = local_38 + 1) {
        local_34 = 0;
        while( true ) {
          local_44 = iVar2;
          if (3 < iVar2) {
            local_44 = 3;
          }
          if (local_44 <= local_34) break;
          if (local_34 + -2 < 0) {
            local_58 = 0;
          }
          else {
            local_58 = local_34 + -2;
          }
          if (local_34 + -1 < 0) {
            local_68 = 0;
          }
          else {
            local_68 = local_34 + -1;
          }
          if (iVar2 + -1 < local_34 + 1) {
            local_78 = iVar2 + -1;
          }
          else {
            local_78 = local_34 + 1;
          }
          if (iVar2 + -1 < local_34 + 2) {
            local_88 = iVar2 + -1;
          }
          else {
            local_88 = local_34 + 2;
          }
          if ((int)((uint)*local_20 + (uint)local_20[local_58 * iVar1] * -9 +
                    (uint)local_20[local_68 * iVar1] * 0x23 +
                    (uint)local_20[local_34 * iVar1] * 0x72 +
                    (uint)local_20[local_78 * iVar1] * -0x11 + (uint)local_20[local_88 * iVar1] * 4
                   + 0x40) >> 7 < 0x100) {
            if (local_34 + -2 < 0) {
              local_a0 = 0;
            }
            else {
              local_a0 = local_34 + -2;
            }
            if (local_34 + -1 < 0) {
              local_b0 = 0;
            }
            else {
              local_b0 = local_34 + -1;
            }
            if (iVar2 + -1 < local_34 + 1) {
              local_c0 = iVar2 + -1;
            }
            else {
              local_c0 = local_34 + 1;
            }
            if (iVar2 + -1 < local_34 + 2) {
              local_d0 = iVar2 + -1;
            }
            else {
              local_d0 = local_34 + 2;
            }
            local_8c = (int)((uint)*local_20 + (uint)local_20[local_a0 * iVar1] * -9 +
                             (uint)local_20[local_b0 * iVar1] * 0x23 +
                             (uint)local_20[local_34 * iVar1] * 0x72 +
                             (uint)local_20[local_c0 * iVar1] * -0x11 +
                             (uint)local_20[local_d0 * iVar1] * 4 + 0x40) >> 7;
          }
          else {
            local_8c = 0xff;
          }
          if (local_8c < 1) {
            local_15c = 0;
          }
          else {
            if (local_34 + -2 < 0) {
              local_e0 = 0;
            }
            else {
              local_e0 = local_34 + -2;
            }
            if (local_34 + -1 < 0) {
              local_f0 = 0;
            }
            else {
              local_f0 = local_34 + -1;
            }
            if (iVar2 + -1 < local_34 + 1) {
              local_100 = iVar2 + -1;
            }
            else {
              local_100 = local_34 + 1;
            }
            if (iVar2 + -1 < local_34 + 2) {
              local_110 = iVar2 + -1;
            }
            else {
              local_110 = local_34 + 2;
            }
            if ((int)((uint)*local_20 + (uint)local_20[local_e0 * iVar1] * -9 +
                      (uint)local_20[local_f0 * iVar1] * 0x23 +
                      (uint)local_20[local_34 * iVar1] * 0x72 +
                      (uint)local_20[local_100 * iVar1] * -0x11 +
                      (uint)local_20[local_110 * iVar1] * 4 + 0x40) >> 7 < 0x100) {
              if (local_34 + -2 < 0) {
                local_128 = 0;
              }
              else {
                local_128 = local_34 + -2;
              }
              if (local_34 + -1 < 0) {
                local_138 = 0;
              }
              else {
                local_138 = local_34 + -1;
              }
              if (iVar2 + -1 < local_34 + 1) {
                local_148 = iVar2 + -1;
              }
              else {
                local_148 = local_34 + 1;
              }
              if (iVar2 + -1 < local_34 + 2) {
                local_158 = iVar2 + -1;
              }
              else {
                local_158 = local_34 + 2;
              }
              local_114 = (undefined1)
                          ((int)((uint)*local_20 + (uint)local_20[local_128 * iVar1] * -9 +
                                 (uint)local_20[local_138 * iVar1] * 0x23 +
                                 (uint)local_20[local_34 * iVar1] * 0x72 +
                                 (uint)local_20[local_148 * iVar1] * -0x11 +
                                 (uint)local_20[local_158 * iVar1] * 4 + 0x40) >> 7);
            }
            else {
              local_114 = 0xff;
            }
            local_15c = local_114;
          }
          *(undefined1 *)(local_10 + local_34 * iVar1) = local_15c;
          local_34 = local_34 + 1;
        }
        for (; local_34 < iVar2 + -2; local_34 = local_34 + 1) {
          if ((int)((uint)local_20[(local_34 + -3) * iVar1] +
                    (uint)local_20[(local_34 + -2) * iVar1] * -9 +
                    (uint)local_20[(local_34 + -1) * iVar1] * 0x23 +
                    (uint)local_20[local_34 * iVar1] * 0x72 +
                    (uint)local_20[(local_34 + 1) * iVar1] * -0x11 +
                    (uint)local_20[(local_34 + 2) * iVar1] * 4 + 0x40) >> 7 < 0x100) {
            local_160 = (int)((uint)local_20[(local_34 + -3) * iVar1] +
                              (uint)local_20[(local_34 + -2) * iVar1] * -9 +
                              (uint)local_20[(local_34 + -1) * iVar1] * 0x23 +
                              (uint)local_20[local_34 * iVar1] * 0x72 +
                              (uint)local_20[(local_34 + 1) * iVar1] * -0x11 +
                              (uint)local_20[(local_34 + 2) * iVar1] * 4 + 0x40) >> 7;
          }
          else {
            local_160 = 0xff;
          }
          if (local_160 < 1) {
            local_168 = 0;
          }
          else {
            if ((int)((uint)local_20[(local_34 + -3) * iVar1] +
                      (uint)local_20[(local_34 + -2) * iVar1] * -9 +
                      (uint)local_20[(local_34 + -1) * iVar1] * 0x23 +
                      (uint)local_20[local_34 * iVar1] * 0x72 +
                      (uint)local_20[(local_34 + 1) * iVar1] * -0x11 +
                      (uint)local_20[(local_34 + 2) * iVar1] * 4 + 0x40) >> 7 < 0x100) {
              local_164 = (undefined1)
                          ((int)((uint)local_20[(local_34 + -3) * iVar1] +
                                 (uint)local_20[(local_34 + -2) * iVar1] * -9 +
                                 (uint)local_20[(local_34 + -1) * iVar1] * 0x23 +
                                 (uint)local_20[local_34 * iVar1] * 0x72 +
                                 (uint)local_20[(local_34 + 1) * iVar1] * -0x11 +
                                 (uint)local_20[(local_34 + 2) * iVar1] * 4 + 0x40) >> 7);
            }
            else {
              local_164 = 0xff;
            }
            local_168 = local_164;
          }
          *(undefined1 *)(local_10 + local_34 * iVar1) = local_168;
        }
        for (; local_34 < iVar2; local_34 = local_34 + 1) {
          if (iVar2 + -1 < local_34 + 1) {
            local_178 = iVar2 + -1;
          }
          else {
            local_178 = local_34 + 1;
          }
          if ((int)((uint)local_20[(local_34 + -3) * iVar1] +
                    (uint)local_20[(local_34 + -2) * iVar1] * -9 +
                    (uint)local_20[(local_34 + -1) * iVar1] * 0x23 +
                    (uint)local_20[local_34 * iVar1] * 0x72 +
                    (uint)local_20[local_178 * iVar1] * -0x11 +
                    (uint)local_20[(iVar2 + -1) * iVar1] * 4 + 0x40) >> 7 < 0x100) {
            if (iVar2 + -1 < local_34 + 1) {
              local_190 = iVar2 + -1;
            }
            else {
              local_190 = local_34 + 1;
            }
            local_17c = (int)((uint)local_20[(local_34 + -3) * iVar1] +
                              (uint)local_20[(local_34 + -2) * iVar1] * -9 +
                              (uint)local_20[(local_34 + -1) * iVar1] * 0x23 +
                              (uint)local_20[local_34 * iVar1] * 0x72 +
                              (uint)local_20[local_190 * iVar1] * -0x11 +
                              (uint)local_20[(iVar2 + -1) * iVar1] * 4 + 0x40) >> 7;
          }
          else {
            local_17c = 0xff;
          }
          if (local_17c < 1) {
            local_1bc = 0;
          }
          else {
            if (iVar2 + -1 < local_34 + 1) {
              local_1a0 = iVar2 + -1;
            }
            else {
              local_1a0 = local_34 + 1;
            }
            if ((int)((uint)local_20[(local_34 + -3) * iVar1] +
                      (uint)local_20[(local_34 + -2) * iVar1] * -9 +
                      (uint)local_20[(local_34 + -1) * iVar1] * 0x23 +
                      (uint)local_20[local_34 * iVar1] * 0x72 +
                      (uint)local_20[local_1a0 * iVar1] * -0x11 +
                      (uint)local_20[(iVar2 + -1) * iVar1] * 4 + 0x40) >> 7 < 0x100) {
              if (iVar2 + -1 < local_34 + 1) {
                local_1b8 = iVar2 + -1;
              }
              else {
                local_1b8 = local_34 + 1;
              }
              local_1a4 = (undefined1)
                          ((int)((uint)local_20[(local_34 + -3) * iVar1] +
                                 (uint)local_20[(local_34 + -2) * iVar1] * -9 +
                                 (uint)local_20[(local_34 + -1) * iVar1] * 0x23 +
                                 (uint)local_20[local_34 * iVar1] * 0x72 +
                                 (uint)local_20[local_1b8 * iVar1] * -0x11 +
                                 (uint)local_20[(iVar2 + -1) * iVar1] * 4 + 0x40) >> 7);
            }
            else {
              local_1a4 = 0xff;
            }
            local_1bc = local_1a4;
          }
          *(undefined1 *)(local_10 + local_34 * iVar1) = local_1bc;
        }
        local_10 = local_10 + 1;
        local_20 = local_20 + 1;
      }
      local_10 = local_10 + (iVar1 * iVar2 - iVar1);
      local_20 = local_20 + -(long)iVar1;
    }
    else if (local_30 == 2) {
      for (local_38 = 0; local_38 < iVar1; local_38 = local_38 + 1) {
        local_34 = 0;
        while( true ) {
          local_1c4 = iVar2;
          if (2 < iVar2) {
            local_1c4 = 2;
          }
          if (local_1c4 <= local_34) break;
          if (local_34 + -1 < 0) {
            local_1d8 = 0;
          }
          else {
            local_1d8 = local_34 + -1;
          }
          if (iVar2 + -1 < local_34 + 1) {
            local_1e8 = iVar2 + -1;
          }
          else {
            local_1e8 = local_34 + 1;
          }
          if (iVar2 + -1 < local_34 + 2) {
            local_1f8 = iVar2 + -1;
          }
          else {
            local_1f8 = local_34 + 2;
          }
          if (iVar2 + -1 < local_34 + 3) {
            local_208 = iVar2 + -1;
          }
          else {
            local_208 = local_34 + 3;
          }
          if ((int)((uint)*local_20 * 4 + (uint)local_20[local_1d8 * iVar1] * -0x11 +
                    (uint)local_20[local_34 * iVar1] * 0x72 +
                    (uint)local_20[local_1e8 * iVar1] * 0x23 +
                    (uint)local_20[local_1f8 * iVar1] * -9 + (uint)local_20[local_208 * iVar1] +
                   0x40) >> 7 < 0x100) {
            if (local_34 + -1 < 0) {
              local_220 = 0;
            }
            else {
              local_220 = local_34 + -1;
            }
            if (iVar2 + -1 < local_34 + 1) {
              local_230 = iVar2 + -1;
            }
            else {
              local_230 = local_34 + 1;
            }
            in_stack_fffffffffffffdc4 =
                 (uint)*local_20 * 4 + (uint)local_20[local_220 * iVar1] * -0x11 +
                 (uint)local_20[local_34 * iVar1] * 0x72 + (uint)local_20[local_230 * iVar1] * 0x23;
            if (iVar2 + -1 < local_34 + 2) {
              in_stack_fffffffffffffdc0 = iVar2 + -1;
            }
            else {
              in_stack_fffffffffffffdc0 = local_34 + 2;
            }
            if (iVar2 + -1 < local_34 + 3) {
              local_250 = iVar2 + -1;
            }
            else {
              local_250 = local_34 + 3;
            }
            local_20c = (int)(in_stack_fffffffffffffdc4 +
                              (uint)local_20[in_stack_fffffffffffffdc0 * iVar1] * -9 +
                              (uint)local_20[local_250 * iVar1] + 0x40) >> 7;
            in_stack_fffffffffffffdb8 = local_20;
            in_stack_fffffffffffffdc8 = local_20;
          }
          else {
            local_20c = 0xff;
          }
          if (local_20c < 1) {
            local_2dc = 0;
          }
          else {
            if (local_34 + -1 < 0) {
              local_260 = 0;
            }
            else {
              local_260 = local_34 + -1;
            }
            if (iVar2 + -1 < local_34 + 1) {
              local_270 = iVar2 + -1;
            }
            else {
              local_270 = local_34 + 1;
            }
            if (iVar2 + -1 < local_34 + 2) {
              local_280 = iVar2 + -1;
            }
            else {
              local_280 = local_34 + 2;
            }
            if (iVar2 + -1 < local_34 + 3) {
              local_290 = iVar2 + -1;
            }
            else {
              local_290 = local_34 + 3;
            }
            if ((int)((uint)*local_20 * 4 + (uint)local_20[local_260 * iVar1] * -0x11 +
                      (uint)local_20[local_34 * iVar1] * 0x72 +
                      (uint)local_20[local_270 * iVar1] * 0x23 +
                      (uint)local_20[local_280 * iVar1] * -9 + (uint)local_20[local_290 * iVar1] +
                     0x40) >> 7 < 0x100) {
              if (local_34 + -1 < 0) {
                local_2a8 = 0;
              }
              else {
                local_2a8 = local_34 + -1;
              }
              if (iVar2 + -1 < local_34 + 1) {
                local_2b8 = iVar2 + -1;
              }
              else {
                local_2b8 = local_34 + 1;
              }
              if (iVar2 + -1 < local_34 + 2) {
                local_2c8 = iVar2 + -1;
              }
              else {
                local_2c8 = local_34 + 2;
              }
              if (iVar2 + -1 < local_34 + 3) {
                local_2d8 = iVar2 + -1;
              }
              else {
                local_2d8 = local_34 + 3;
              }
              local_294 = (undefined1)
                          ((int)((uint)*local_20 * 4 + (uint)local_20[local_2a8 * iVar1] * -0x11 +
                                 (uint)local_20[local_34 * iVar1] * 0x72 +
                                 (uint)local_20[local_2b8 * iVar1] * 0x23 +
                                 (uint)local_20[local_2c8 * iVar1] * -9 +
                                 (uint)local_20[local_2d8 * iVar1] + 0x40) >> 7);
            }
            else {
              local_294 = 0xff;
            }
            local_2dc = local_294;
          }
          *(undefined1 *)(local_10 + local_34 * iVar1) = local_2dc;
          local_34 = local_34 + 1;
        }
        for (; local_34 < iVar2 + -3; local_34 = local_34 + 1) {
          if ((int)((uint)local_20[(local_34 + -2) * iVar1] * 4 +
                    (uint)local_20[(local_34 + -1) * iVar1] * -0x11 +
                    (uint)local_20[local_34 * iVar1] * 0x72 +
                    (uint)local_20[(local_34 + 1) * iVar1] * 0x23 +
                    (uint)local_20[(local_34 + 2) * iVar1] * -9 +
                    (uint)local_20[(local_34 + 3) * iVar1] + 0x40) >> 7 < 0x100) {
            local_2e0 = (int)((uint)local_20[(local_34 + -2) * iVar1] * 4 +
                              (uint)local_20[(local_34 + -1) * iVar1] * -0x11 +
                              (uint)local_20[local_34 * iVar1] * 0x72 +
                              (uint)local_20[(local_34 + 1) * iVar1] * 0x23 +
                              (uint)local_20[(local_34 + 2) * iVar1] * -9 +
                              (uint)local_20[(local_34 + 3) * iVar1] + 0x40) >> 7;
          }
          else {
            local_2e0 = 0xff;
          }
          if (local_2e0 < 1) {
            local_2e8 = 0;
          }
          else {
            if ((int)((uint)local_20[(local_34 + -2) * iVar1] * 4 +
                      (uint)local_20[(local_34 + -1) * iVar1] * -0x11 +
                      (uint)local_20[local_34 * iVar1] * 0x72 +
                      (uint)local_20[(local_34 + 1) * iVar1] * 0x23 +
                      (uint)local_20[(local_34 + 2) * iVar1] * -9 +
                      (uint)local_20[(local_34 + 3) * iVar1] + 0x40) >> 7 < 0x100) {
              local_2e4 = (undefined1)
                          ((int)((uint)local_20[(local_34 + -2) * iVar1] * 4 +
                                 (uint)local_20[(local_34 + -1) * iVar1] * -0x11 +
                                 (uint)local_20[local_34 * iVar1] * 0x72 +
                                 (uint)local_20[(local_34 + 1) * iVar1] * 0x23 +
                                 (uint)local_20[(local_34 + 2) * iVar1] * -9 +
                                 (uint)local_20[(local_34 + 3) * iVar1] + 0x40) >> 7);
            }
            else {
              local_2e4 = 0xff;
            }
            local_2e8 = local_2e4;
          }
          *(undefined1 *)(local_10 + local_34 * iVar1) = local_2e8;
        }
        for (; local_34 < iVar2; local_34 = local_34 + 1) {
          if (iVar2 + -1 < local_34 + 1) {
            local_2f8 = iVar2 + -1;
          }
          else {
            local_2f8 = local_34 + 1;
          }
          if (iVar2 + -1 < local_34 + 2) {
            local_308 = iVar2 + -1;
          }
          else {
            local_308 = local_34 + 2;
          }
          if ((int)((uint)local_20[(local_34 + -2) * iVar1] * 4 +
                    (uint)local_20[(local_34 + -1) * iVar1] * -0x11 +
                    (uint)local_20[local_34 * iVar1] * 0x72 +
                    (uint)local_20[local_2f8 * iVar1] * 0x23 +
                    (uint)local_20[local_308 * iVar1] * -9 + (uint)local_20[(iVar2 + -1) * iVar1] +
                   0x40) >> 7 < 0x100) {
            if (iVar2 + -1 < local_34 + 1) {
              local_320 = iVar2 + -1;
            }
            else {
              local_320 = local_34 + 1;
            }
            if (iVar2 + -1 < local_34 + 2) {
              local_330 = iVar2 + -1;
            }
            else {
              local_330 = local_34 + 2;
            }
            local_30c = (int)((uint)local_20[(local_34 + -2) * iVar1] * 4 +
                              (uint)local_20[(local_34 + -1) * iVar1] * -0x11 +
                              (uint)local_20[local_34 * iVar1] * 0x72 +
                              (uint)local_20[local_320 * iVar1] * 0x23 +
                              (uint)local_20[local_330 * iVar1] * -9 +
                              (uint)local_20[(iVar2 + -1) * iVar1] + 0x40) >> 7;
          }
          else {
            local_30c = 0xff;
          }
          if (local_30c < 1) {
            local_37c = 0;
          }
          else {
            if (iVar2 + -1 < local_34 + 1) {
              local_340 = iVar2 + -1;
            }
            else {
              local_340 = local_34 + 1;
            }
            if (iVar2 + -1 < local_34 + 2) {
              local_350 = iVar2 + -1;
            }
            else {
              local_350 = local_34 + 2;
            }
            if ((int)((uint)local_20[(local_34 + -2) * iVar1] * 4 +
                      (uint)local_20[(local_34 + -1) * iVar1] * -0x11 +
                      (uint)local_20[local_34 * iVar1] * 0x72 +
                      (uint)local_20[local_340 * iVar1] * 0x23 +
                      (uint)local_20[local_350 * iVar1] * -9 + (uint)local_20[(iVar2 + -1) * iVar1]
                     + 0x40) >> 7 < 0x100) {
              if (iVar2 + -1 < local_34 + 1) {
                local_368 = iVar2 + -1;
              }
              else {
                local_368 = local_34 + 1;
              }
              if (iVar2 + -1 < local_34 + 2) {
                local_378 = iVar2 + -1;
              }
              else {
                local_378 = local_34 + 2;
              }
              local_354 = (undefined1)
                          ((int)((uint)local_20[(local_34 + -2) * iVar1] * 4 +
                                 (uint)local_20[(local_34 + -1) * iVar1] * -0x11 +
                                 (uint)local_20[local_34 * iVar1] * 0x72 +
                                 (uint)local_20[local_368 * iVar1] * 0x23 +
                                 (uint)local_20[local_378 * iVar1] * -9 +
                                 (uint)local_20[(iVar2 + -1) * iVar1] + 0x40) >> 7);
            }
            else {
              local_354 = 0xff;
            }
            local_37c = local_354;
          }
          *(undefined1 *)(local_10 + local_34 * iVar1) = local_37c;
        }
        local_10 = local_10 + 1;
        local_20 = local_20 + 1;
      }
    }
  }
  return;
}

Assistant:

static void y4m_convert_42xpaldv_42xjpeg(y4m_input *_y4m, unsigned char *_dst,
                                         unsigned char *_aux) {
  unsigned char *tmp;
  int c_w;
  int c_h;
  int c_sz;
  int pli;
  int y;
  int x;
  /*Skip past the luma data.*/
  _dst += _y4m->pic_w * _y4m->pic_h;
  /*Compute the size of each chroma plane.*/
  c_w = (_y4m->pic_w + 1) / 2;
  c_h = (_y4m->pic_h + _y4m->dst_c_dec_h - 1) / _y4m->dst_c_dec_h;
  c_sz = c_w * c_h;
  tmp = _aux + 2 * c_sz;
  for (pli = 1; pli < 3; pli++) {
    /*First do the horizontal re-sampling.
      This is the same as the mpeg2 case, except that after the horizontal
       case, we need to apply a second vertical filter.*/
    y4m_42xmpeg2_42xjpeg_helper(tmp, _aux, c_w, c_h);
    _aux += c_sz;
    switch (pli) {
      case 1: {
        /*Slide C_b up a quarter-pel.
          This is the same filter used above, but in the other order.*/
        for (x = 0; x < c_w; x++) {
          for (y = 0; y < OC_MINI(c_h, 3); y++) {
            _dst[y * c_w] = (unsigned char)OC_CLAMPI(
                0,
                (tmp[0] - 9 * tmp[OC_MAXI(y - 2, 0) * c_w] +
                 35 * tmp[OC_MAXI(y - 1, 0) * c_w] + 114 * tmp[y * c_w] -
                 17 * tmp[OC_MINI(y + 1, c_h - 1) * c_w] +
                 4 * tmp[OC_MINI(y + 2, c_h - 1) * c_w] + 64) >>
                    7,
                255);
          }
          for (; y < c_h - 2; y++) {
            _dst[y * c_w] = (unsigned char)OC_CLAMPI(
                0,
                (tmp[(y - 3) * c_w] - 9 * tmp[(y - 2) * c_w] +
                 35 * tmp[(y - 1) * c_w] + 114 * tmp[y * c_w] -
                 17 * tmp[(y + 1) * c_w] + 4 * tmp[(y + 2) * c_w] + 64) >>
                    7,
                255);
          }
          for (; y < c_h; y++) {
            _dst[y * c_w] = (unsigned char)OC_CLAMPI(
                0,
                (tmp[(y - 3) * c_w] - 9 * tmp[(y - 2) * c_w] +
                 35 * tmp[(y - 1) * c_w] + 114 * tmp[y * c_w] -
                 17 * tmp[OC_MINI(y + 1, c_h - 1) * c_w] +
                 4 * tmp[(c_h - 1) * c_w] + 64) >>
                    7,
                255);
          }
          _dst++;
          tmp++;
        }
        _dst += c_sz - c_w;
        tmp -= c_w;
      } break;
      case 2: {
        /*Slide C_r down a quarter-pel.
          This is the same as the horizontal filter.*/
        for (x = 0; x < c_w; x++) {
          for (y = 0; y < OC_MINI(c_h, 2); y++) {
            _dst[y * c_w] = (unsigned char)OC_CLAMPI(
                0,
                (4 * tmp[0] - 17 * tmp[OC_MAXI(y - 1, 0) * c_w] +
                 114 * tmp[y * c_w] + 35 * tmp[OC_MINI(y + 1, c_h - 1) * c_w] -
                 9 * tmp[OC_MINI(y + 2, c_h - 1) * c_w] +
                 tmp[OC_MINI(y + 3, c_h - 1) * c_w] + 64) >>
                    7,
                255);
          }
          for (; y < c_h - 3; y++) {
            _dst[y * c_w] = (unsigned char)OC_CLAMPI(
                0,
                (4 * tmp[(y - 2) * c_w] - 17 * tmp[(y - 1) * c_w] +
                 114 * tmp[y * c_w] + 35 * tmp[(y + 1) * c_w] -
                 9 * tmp[(y + 2) * c_w] + tmp[(y + 3) * c_w] + 64) >>
                    7,
                255);
          }
          for (; y < c_h; y++) {
            _dst[y * c_w] = (unsigned char)OC_CLAMPI(
                0,
                (4 * tmp[(y - 2) * c_w] - 17 * tmp[(y - 1) * c_w] +
                 114 * tmp[y * c_w] + 35 * tmp[OC_MINI(y + 1, c_h - 1) * c_w] -
                 9 * tmp[OC_MINI(y + 2, c_h - 1) * c_w] + tmp[(c_h - 1) * c_w] +
                 64) >>
                    7,
                255);
          }
          _dst++;
          tmp++;
        }
      } break;
    }
    /*For actual interlaced material, this would have to be done separately on
       each field, and the shift amounts would be different.
      C_r moves down 1/8, C_b up 3/8 in the top field, and C_r moves down 3/8,
       C_b up 1/8 in the bottom field.
      The corresponding filters would be:
       Down 1/8 (reverse order for up): [3 -11 125 15 -4 0]/128
       Down 3/8 (reverse order for up): [4 -19 98 56 -13 2]/128*/
  }
}